

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderPrimitiveCoverage::verifyDrawBufferContents
          (TessellationShaderPrimitiveCoverage *this)

{
  ostringstream *this_00;
  GLubyte GVar1;
  GLubyte GVar2;
  GLubyte GVar3;
  GLubyte GVar4;
  GLubyte *pGVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  ulong uVar10;
  bool bVar11;
  GLubyte expected_result_ubyte [4];
  GLubyte rendered_result_ubyte [4];
  GLubyte local_1c2;
  char local_1c1;
  undefined4 local_1c0;
  undefined4 local_1bc;
  TessellationShaderPrimitiveCoverage *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar9;
  
  iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar9 + 0x1218))(0x8ce0);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glReadBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2a9);
  (**(code **)(lVar9 + 0x1220))(0,0,0x800,0x800,0x1908,0x1401,this->m_rendered_data_buffer);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2b0);
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar6 = true;
  uVar10 = 0;
  local_1b8 = this;
  do {
    local_1c0 = 0x204080ff;
    pGVar5 = this->m_rendered_data_buffer;
    GVar1 = pGVar5[uVar10];
    GVar2 = pGVar5[uVar10 + 1];
    GVar3 = pGVar5[uVar10 + 2];
    GVar4 = pGVar5[uVar10 + 3];
    local_1bc = CONCAT13(GVar4,CONCAT12(GVar3,CONCAT11(GVar2,GVar1)));
    local_1c1 = local_1bc != 0x204080ff;
    if ((bool)local_1c1) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Rendered pixel at index (",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") of value (",0xc);
      local_1c2 = GVar1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = GVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = GVar3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = GVar4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,") does not match expected pixel (",0x21);
      local_1c2 = (GLubyte)local_1c0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = local_1c0._1_1_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = local_1c0._2_1_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1c2 = local_1c0._3_1_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1c2,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar6 = false;
      this = local_1b8;
    }
  } while ((local_1c1 == '\0') && (bVar11 = uVar10 < 0x3ffffc, uVar10 = uVar10 + 4, bVar11));
  return bVar6;
}

Assistant:

bool TessellationShaderPrimitiveCoverage::verifyDrawBufferContents(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch the data */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed");

	gl.readPixels(0,						  /* x */
				  0,						  /* y */
				  m_height, m_width, GL_RGBA, /* format */
				  GL_UNSIGNED_BYTE,			  /* type */
				  m_rendered_data_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

	/* Verify result data */
	bool result = true;

	for (glw::GLuint n_pixel = 0; n_pixel < (m_rendered_data_buffer_size >> 2); n_pixel += m_n_components)
	{
		glw::GLubyte expected_result_ubyte[] = { (glw::GLubyte)(m_clear_color[0] * 255.0f),
												 (glw::GLubyte)(m_clear_color[1] * 255.0f),
												 (glw::GLubyte)(m_clear_color[2] * 255.0f),
												 (glw::GLubyte)(m_clear_color[3] * 255.0f) };
		glw::GLubyte rendered_result_ubyte[] = { m_rendered_data_buffer[n_pixel + 0],
												 m_rendered_data_buffer[n_pixel + 1],
												 m_rendered_data_buffer[n_pixel + 2],
												 m_rendered_data_buffer[n_pixel + 3] };

		if (memcmp(expected_result_ubyte, rendered_result_ubyte, sizeof(rendered_result_ubyte)) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendered pixel at index (" << n_pixel << ") of value"
																									 " ("
							   << rendered_result_ubyte[0] << ", " << rendered_result_ubyte[1] << ", "
							   << rendered_result_ubyte[2] << ", " << rendered_result_ubyte[3]
							   << ") does not match expected pixel"
								  " ("
							   << expected_result_ubyte[0] << ", " << expected_result_ubyte[1] << ", "
							   << expected_result_ubyte[2] << ", " << expected_result_ubyte[3] << ")"
							   << tcu::TestLog::EndMessage;

			result = false;

			break;
		} /* if (rendered pixel is invalid) */
	}	 /* for (all pixels) */

	return result;
}